

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

int __thiscall QList<QLayoutItem_*>::remove(QList<QLayoutItem_*> *this,char *__filename)

{
  QList<QLayoutItem_*> *extraout_RAX;
  long in_RDX;
  qsizetype in_stack_00000010;
  QLayoutItem **in_stack_00000018;
  QPodArrayOps<QLayoutItem_*> *in_stack_00000020;
  QArrayDataPointer<QLayoutItem_*> *in_stack_ffffffffffffffd8;
  
  if (in_RDX != 0) {
    QArrayDataPointer<QLayoutItem_*>::detach(&this->d,in_stack_ffffffffffffffd8);
    QArrayDataPointer<QLayoutItem_*>::operator->(&this->d);
    QArrayDataPointer<QLayoutItem_*>::operator->(&this->d);
    QArrayDataPointer<QLayoutItem_*>::begin((QArrayDataPointer<QLayoutItem_*> *)0x353a79);
    QtPrivate::QPodArrayOps<QLayoutItem_*>::erase
              (in_stack_00000020,in_stack_00000018,in_stack_00000010);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

inline void QList<T>::remove(qsizetype i, qsizetype n)
{
    Q_ASSERT_X(size_t(i) + size_t(n) <= size_t(d->size), "QList::remove", "index out of range");
    Q_ASSERT_X(n >= 0, "QList::remove", "invalid count");

    if (n == 0)
        return;

    d.detach();
    d->erase(d->begin() + i, n);
}